

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_1::TrianglesCase::generateTriangles
          (TrianglesCase *this,int iteration,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *outData,
          vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          *outTriangles)

{
  ostringstream *poVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  pointer pVVar12;
  pointer pSVar13;
  ulong uVar14;
  undefined8 uVar15;
  long lVar16;
  long lVar17;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  uVar14 = (ulong)(uint)iteration;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(outData,6);
  if ((uint)iteration < 3) {
    fVar2 = *(float *)(&DAT_01c07504 + uVar14 * 4);
    fVar3 = *(float *)(&DAT_01c0760c + uVar14 * 4);
    fVar4 = *(float *)(&DAT_01c07618 + uVar14 * 4);
    fVar5 = *(float *)(&DAT_01c07510 + uVar14 * 4);
    fVar6 = *(float *)(&DAT_01c07630 + uVar14 * 4);
    fVar7 = *(float *)(&DAT_01c0751c + uVar14 * 4);
    fVar8 = *(float *)(&DAT_01c075c4 + uVar14 * 4);
    fVar9 = *(float *)(&DAT_01c075d0 + uVar14 * 4);
    fVar10 = *(float *)(&DAT_01c07528 + uVar14 * 4);
    fVar11 = *(float *)(&DAT_01c07534 + uVar14 * 4);
    pVVar12 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar12->m_data[0] = *(float *)(&DAT_01c074f8 + uVar14 * 4);
    pVVar12->m_data[1] = fVar2;
    pVVar12->m_data[2] = 0.0;
    pVVar12->m_data[3] = 1.0;
    pVVar12 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar12[1].m_data[0] = fVar3;
    pVVar12[1].m_data[1] = fVar4;
    pVVar12[1].m_data[2] = 0.0;
    pVVar12[1].m_data[3] = 1.0;
    pVVar12 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar12[2].m_data[0] = fVar5;
    pVVar12[2].m_data[1] = fVar6;
    pVVar12[2].m_data[2] = 0.0;
    pVVar12[2].m_data[3] = 1.0;
    pVVar12 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar12[3].m_data[0] = fVar7;
    pVVar12[3].m_data[1] = 0.2;
    pVVar12[3].m_data[2] = 0.0;
    pVVar12[3].m_data[3] = 1.0;
    pVVar12 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar12[4].m_data[0] = fVar8;
    pVVar12[4].m_data[1] = fVar9;
    pVVar12[4].m_data[2] = 0.0;
    pVVar12[4].m_data[3] = 1.0;
    pVVar12 = (outData->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pVVar12[5].m_data[0] = fVar10;
    pVVar12[5].m_data[1] = fVar11;
    pVVar12[5].m_data[2] = 0.0;
    pVVar12[5].m_data[3] = 1.0;
  }
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::resize(outTriangles,2);
  pVVar12 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pSVar13 = (outTriangles->
            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar15 = *(undefined8 *)(pVVar12->m_data + 2);
  *(undefined8 *)pSVar13->positions[0].m_data = *(undefined8 *)pVVar12->m_data;
  *(undefined8 *)(pSVar13->positions[0].m_data + 2) = uVar15;
  pSVar13 = (outTriangles->
            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pSVar13->sharedEdge[0] = false;
  pVVar12 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar15 = *(undefined8 *)(pVVar12[1].m_data + 2);
  *(undefined8 *)pSVar13->positions[1].m_data = *(undefined8 *)pVVar12[1].m_data;
  *(undefined8 *)(pSVar13->positions[1].m_data + 2) = uVar15;
  pSVar13 = (outTriangles->
            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pSVar13->sharedEdge[1] = false;
  pVVar12 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar15 = *(undefined8 *)(pVVar12[2].m_data + 2);
  *(undefined8 *)pSVar13->positions[2].m_data = *(undefined8 *)pVVar12[2].m_data;
  *(undefined8 *)(pSVar13->positions[2].m_data + 2) = uVar15;
  pSVar13 = (outTriangles->
            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pSVar13->sharedEdge[2] = false;
  pVVar12 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar15 = *(undefined8 *)(pVVar12[3].m_data + 2);
  *(undefined8 *)pSVar13[1].positions[0].m_data = *(undefined8 *)pVVar12[3].m_data;
  *(undefined8 *)(pSVar13[1].positions[0].m_data + 2) = uVar15;
  pSVar13 = (outTriangles->
            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pSVar13[1].sharedEdge[0] = false;
  pVVar12 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar15 = *(undefined8 *)(pVVar12[4].m_data + 2);
  *(undefined8 *)pSVar13[1].positions[1].m_data = *(undefined8 *)pVVar12[4].m_data;
  *(undefined8 *)(pSVar13[1].positions[1].m_data + 2) = uVar15;
  pSVar13 = (outTriangles->
            super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pSVar13[1].sharedEdge[1] = false;
  pVVar12 = (outData->
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar15 = *(undefined8 *)(pVVar12[5].m_data + 2);
  *(undefined8 *)pSVar13[1].positions[2].m_data = *(undefined8 *)pVVar12[5].m_data;
  *(undefined8 *)(pSVar13[1].positions[2].m_data + 2) = uVar15;
  (outTriangles->
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  )._M_impl.super__Vector_impl_data._M_start[1].sharedEdge[2] = false;
  local_1b0._0_8_ =
       ((this->super_BaseTriangleCase).super_BaseRenderingCase.super_TestCase.super_TestCase.
        super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Rendering ",10);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," triangle(s):",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  if (0 < (int)((ulong)((long)(outTriangles->
                              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(outTriangles->
                             super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x3d70a3d7) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    lVar17 = 0;
    lVar16 = 0;
    do {
      local_1b0._0_8_ =
           ((this->super_BaseTriangleCase).super_BaseRenderingCase.super_TestCase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Triangle ",9);
      lVar16 = lVar16 + 1;
      std::ostream::operator<<(poVar1,(int)lVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n\t",2);
      tcu::operator<<((ostream *)poVar1,
                      (Vector<float,_4> *)
                      ((long)((outTriangles->
                              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                              )._M_impl.super__Vector_impl_data._M_start)->positions[0].m_data +
                      lVar17));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n\t",2);
      tcu::operator<<((ostream *)poVar1,
                      (Vector<float,_4> *)
                      ((long)((outTriangles->
                              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                              )._M_impl.super__Vector_impl_data._M_start)->positions[1].m_data +
                      lVar17));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n\t",2);
      tcu::operator<<((ostream *)poVar1,
                      (Vector<float,_4> *)
                      ((long)((outTriangles->
                              super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                              )._M_impl.super__Vector_impl_data._M_start)->positions[2].m_data +
                      lVar17));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      lVar17 = lVar17 + 100;
    } while (lVar16 < (int)((ulong)((long)(outTriangles->
                                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(outTriangles->
                                         super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 2) *
                      -0x3d70a3d7);
  }
  return;
}

Assistant:

void TrianglesCase::generateTriangles (int iteration, std::vector<tcu::Vec4>& outData, std::vector<TriangleSceneSpec::SceneTriangle>& outTriangles)
{
	outData.resize(6);

	switch (iteration)
	{
		case 0:
			// \note: these values are chosen arbitrarily
			outData[0] = tcu::Vec4( 0.2f,  0.8f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4( 0.5f,  0.2f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4( 0.5f,  0.3f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(-0.5f,  0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4(-1.5f, -0.4f, 0.0f, 1.0f);
			outData[5] = tcu::Vec4(-0.4f,  0.2f, 0.0f, 1.0f);
			break;

		case 1:
			outData[0] = tcu::Vec4(-0.499f, 0.128f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4(-0.501f,  -0.3f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4(  0.11f,  -0.2f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(  0.11f,   0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4(  0.88f,   0.9f, 0.0f, 1.0f);
			outData[5] = tcu::Vec4(   0.4f,   1.2f, 0.0f, 1.0f);
			break;

		case 2:
			outData[0] = tcu::Vec4( -0.9f, -0.3f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4(  1.1f, -0.9f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4( -1.1f, -0.1f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(-0.11f,  0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4( 0.88f,  0.7f, 0.0f, 1.0f);
			outData[5] = tcu::Vec4( -0.4f,  0.4f, 0.0f, 1.0f);
			break;
	}

	outTriangles.resize(2);
	outTriangles[0].positions[0] = outData[0];	outTriangles[0].sharedEdge[0] = false;
	outTriangles[0].positions[1] = outData[1];	outTriangles[0].sharedEdge[1] = false;
	outTriangles[0].positions[2] = outData[2];	outTriangles[0].sharedEdge[2] = false;

	outTriangles[1].positions[0] = outData[3];	outTriangles[1].sharedEdge[0] = false;
	outTriangles[1].positions[1] = outData[4];	outTriangles[1].sharedEdge[1] = false;
	outTriangles[1].positions[2] = outData[5];	outTriangles[1].sharedEdge[2] = false;

	// log
	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering " << outTriangles.size() << " triangle(s):" << tcu::TestLog::EndMessage;
	for (int triangleNdx = 0; triangleNdx < (int)outTriangles.size(); ++triangleNdx)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Triangle " << (triangleNdx+1) << ":"
			<< "\n\t" << outTriangles[triangleNdx].positions[0]
			<< "\n\t" << outTriangles[triangleNdx].positions[1]
			<< "\n\t" << outTriangles[triangleNdx].positions[2]
			<< tcu::TestLog::EndMessage;
	}
}